

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O3

vector<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_> *
__thiscall
iDynTree::optimalcontrol::OptimalControlProblem::getConstraintsTimeRanges
          (OptimalControlProblem *this)

{
  _Rb_tree_header *p_Var1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  pointer pTVar4;
  undefined8 uVar5;
  uint uVar6;
  vector<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
  *pvVar7;
  _Base_ptr p_Var8;
  OptimalControlProblemPimpl *pOVar9;
  pointer pTVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  
  uVar6 = countConstraints(this);
  pOVar9 = this->m_pimpl;
  if (((long)(pOVar9->constraintsTimeRanges).
             super__Vector_base<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(pOVar9->constraintsTimeRanges).
             super__Vector_base<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - (ulong)uVar6 !=
      0) {
    std::
    vector<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
    ::resize(&pOVar9->constraintsTimeRanges,(ulong)uVar6);
    pOVar9 = this->m_pimpl;
  }
  p_Var8 = (pOVar9->constraintsGroups)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(pOVar9->constraintsGroups)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var8 != p_Var1) {
    lVar13 = 0;
    do {
      pvVar7 = ConstraintsGroup::getTimeRanges((ConstraintsGroup *)**(undefined8 **)(p_Var8 + 2));
      pTVar10 = (pvVar7->
                super__Vector_base<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((pvVar7->
          super__Vector_base<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
          )._M_impl.super__Vector_impl_data._M_finish != pTVar10) {
        lVar12 = 0;
        uVar11 = 0;
        do {
          pTVar4 = (this->m_pimpl->constraintsTimeRanges).
                   super__Vector_base<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          (&pTVar4[lVar13].m_anyTime)[lVar12] = (&pTVar10->m_anyTime)[lVar12];
          puVar2 = (undefined8 *)((long)&pTVar10->m_initTime + lVar12);
          uVar5 = puVar2[1];
          puVar3 = (undefined8 *)((long)&pTVar4[lVar13].m_initTime + lVar12);
          *puVar3 = *puVar2;
          puVar3[1] = uVar5;
          uVar11 = uVar11 + 1;
          pTVar10 = (pvVar7->
                    super__Vector_base<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          lVar12 = lVar12 + 0x18;
        } while (uVar11 < (ulong)(((long)(pvVar7->
                                         super__Vector_base<iDynTree::optimalcontrol::TimeRange,_std::allocator<iDynTree::optimalcontrol::TimeRange>_>
                                         )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar10
                                  >> 3) * -0x5555555555555555));
        lVar13 = lVar13 + uVar11;
      }
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while ((_Rb_tree_header *)p_Var8 != p_Var1);
    pOVar9 = this->m_pimpl;
  }
  return &pOVar9->constraintsTimeRanges;
}

Assistant:

std::vector<TimeRange> &OptimalControlProblem::getConstraintsTimeRanges() const
        {
            unsigned int nc = countConstraints();

            if (m_pimpl->constraintsTimeRanges.size() != nc)
                m_pimpl->constraintsTimeRanges.resize(nc);

            size_t index = 0;

            for (auto& group : m_pimpl->constraintsGroups){
                std::vector<TimeRange> &groupTimeRanges = group.second->group_ptr->getTimeRanges();
                for (size_t i = 0; i < groupTimeRanges.size(); ++i){
                    m_pimpl->constraintsTimeRanges[index] = groupTimeRanges[i];
                    ++index;
                }
            }
            return m_pimpl->constraintsTimeRanges;
        }